

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O3

Vector<float,_3,_true> __thiscall
Nova::Vector<float,_3,_true>::operator+(Vector<float,_3,_true> *this,Vector<float,_3,_true> *a)

{
  long lVar1;
  long in_RDX;
  float in_XMM1_Da;
  Vector<float,_3,_true> VVar2;
  
  Vector(this,a);
  lVar1 = 0;
  do {
    VVar2._data._M_elems[0] =
         *(float *)((long)(this->_data)._M_elems + lVar1) + *(float *)(in_RDX + lVar1);
    VVar2._data._M_elems[1] = 0.0;
    *(float *)((long)(this->_data)._M_elems + lVar1) = VVar2._data._M_elems[0];
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0xc);
  VVar2._data._M_elems[2] = in_XMM1_Da;
  return (Vector<float,_3,_true>)VVar2._data._M_elems;
}

Assistant:

Vector operator+(const Vector& a) const
    {
        Vector data_copy(*this);
        data_copy+=a;
        return data_copy;
    }